

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cauchy_dist.hpp
# Opt level: O0

result_type_conflict2 __thiscall
trng::cauchy_dist<double>::icdf(cauchy_dist<double> *this,result_type_conflict2 x)

{
  int *piVar1;
  double in_XMM0_Qa;
  double dVar2;
  cauchy_dist<double> *unaff_retaddr;
  result_type_conflict2 in_stack_fffffffffffffff8;
  
  if ((in_XMM0_Qa <= 0.0) || (1.0 <= in_XMM0_Qa)) {
    piVar1 = __errno_location();
    *piVar1 = 0x21;
    dVar2 = std::numeric_limits<double>::quiet_NaN();
  }
  else if ((in_XMM0_Qa != 0.0) || (NAN(in_XMM0_Qa))) {
    if ((in_XMM0_Qa != 1.0) || (NAN(in_XMM0_Qa))) {
      dVar2 = icdf_(unaff_retaddr,in_stack_fffffffffffffff8);
    }
    else {
      dVar2 = std::numeric_limits<double>::infinity();
    }
  }
  else {
    dVar2 = std::numeric_limits<double>::infinity();
    dVar2 = -dVar2;
  }
  return dVar2;
}

Assistant:

icdf(result_type x) const {
      if (x <= 0 or x >= 1) {
#if !(defined TRNG_CUDA)
        errno = EDOM;
#endif
        return math::numeric_limits<result_type>::quiet_NaN();
      }
      if (x == 0)
        return -math::numeric_limits<result_type>::infinity();
      if (x == 1)
        return math::numeric_limits<result_type>::infinity();
      return icdf_(x);
    }